

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<int,unsigned_long,unsigned_long>
               (stringstream *oss,string *fmt,int value,unsigned_long args,unsigned_long args_1)

{
  ostream *this;
  ostream *poVar1;
  byte bVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  ostream oVar8;
  runtime_error *prVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  string local_70;
  char *local_50;
  int local_44;
  unsigned_long local_40;
  unsigned_long local_38;
  
  bVar16 = fmt->_M_string_length != 0;
  local_44 = value;
  local_40 = args;
  local_38 = args_1;
  if (bVar16) {
    this = (ostream *)(oss + 0x10);
    uVar15 = 0;
    do {
      pcVar4 = (fmt->_M_dataplus)._M_p;
      uVar12 = uVar15;
      if ((pcVar4[uVar15] == '%') && (uVar12 = uVar15 + 1, pcVar4[uVar15 + 1] != '%')) {
        uVar15 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar12);
        if (uVar15 <= uVar12) {
          bVar7 = false;
          uVar13 = uVar12;
          goto LAB_00116d20;
        }
        bVar7 = false;
        goto LAB_00116c4b;
      }
      local_70._M_dataplus._M_p._0_1_ = pcVar4[uVar12];
      std::__ostream_insert<char,std::char_traits<char>>(this,(char *)&local_70,1);
      uVar15 = uVar12 + 1;
      bVar16 = uVar15 < fmt->_M_string_length;
    } while (bVar16);
  }
  goto LAB_00116bea;
LAB_00116c4b:
  do {
    bVar2 = (fmt->_M_dataplus)._M_p[uVar12];
    uVar13 = uVar12;
    if (bVar2 < 0x2b) {
      if (bVar2 != 0x20) {
        if (bVar2 != 0x23) break;
        bVar7 = true;
      }
    }
    else if (bVar2 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar2 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar2 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar1 = this + *(long *)(*(long *)this + -0x18);
        if (oss[*(long *)(*(long *)this + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar8 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar8;
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
      }
    }
    uVar12 = uVar12 + 1;
    uVar13 = uVar15;
  } while (uVar15 != uVar12);
LAB_00116d20:
  std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
  pcVar6 = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
  piVar10 = __errno_location();
  iVar3 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol(pcVar6,&local_50,10);
  pcVar14 = local_50;
  if (local_50 == pcVar6) {
    std::__throw_invalid_argument("stoi");
LAB_00116f8e:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00116f8e;
    if (*piVar10 == 0) {
      *piVar10 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar11;
    pcVar14 = pcVar14 + (uVar13 - (long)pcVar6);
    if (pcVar14[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_00116ed4:
      if ((byte)(pcVar14[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar11 = *(long *)(oss + 0x10);
        lVar5 = *(long *)(lVar11 + -0x18);
        *(uint *)(oss + lVar5 + 0x28) = *(uint *)(oss + lVar5 + 0x28) & 0xffffffb5 | 8;
        if (bVar7) {
          *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::operator<<(this,local_44);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
      sprintf<unsigned_long,unsigned_long>(oss,&local_70,local_40,local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar16) {
        return;
      }
LAB_00116bea:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"extra arguments provided to sprintf");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
    pcVar6 = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(pcVar6,&local_50,10);
    if (local_50 != pcVar6) {
      if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00116fa6;
      if (*piVar10 == 0) {
        *piVar10 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x18) = (long)(int)lVar11;
      pcVar14 = local_50 + (long)(pcVar14 + (1 - (long)pcVar6));
      goto LAB_00116ed4;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00116fa6:
  auVar17 = std::__throw_out_of_range("stoi");
  if (auVar17._8_4_ != 1) {
    _Unwind_Resume(auVar17._0_8_);
  }
  __cxa_begin_catch(auVar17._0_8_);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Expected precision value in sprintf");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}